

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O0

bool __thiscall
absl::lts_20240722::time_internal::cctz::TimeZoneInfo::Load(TimeZoneInfo *this,string *name)

{
  undefined *puVar1;
  bool bVar2;
  pointer zip_00;
  bool local_89;
  anon_class_1_0_00000001 local_51;
  function<std::unique_ptr<absl::lts_20240722::time_internal::cctz::ZoneInfoSource,_std::default_delete<absl::lts_20240722::time_internal::cctz::ZoneInfoSource>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_50;
  unique_ptr<absl::lts_20240722::time_internal::cctz::ZoneInfoSource,_std::default_delete<absl::lts_20240722::time_internal::cctz::ZoneInfoSource>_>
  local_30;
  unique_ptr<absl::lts_20240722::time_internal::cctz::ZoneInfoSource,_std::default_delete<absl::lts_20240722::time_internal::cctz::ZoneInfoSource>_>
  zip;
  duration<long,_std::ratio<1L,_1L>_> offset;
  string *name_local;
  TimeZoneInfo *this_local;
  
  memset(&zip,0,8);
  bVar2 = FixedOffsetFromName(name,(seconds *)&zip);
  puVar1 = cctz_extension::zone_info_source_factory_abi_cxx11_;
  if (bVar2) {
    this_local._7_1_ = ResetToBuiltinUTC(this,(seconds *)&zip);
  }
  else {
    std::
    function<std::unique_ptr<absl::lts_20240722::time_internal::cctz::ZoneInfoSource,std::default_delete<absl::lts_20240722::time_internal::cctz::ZoneInfoSource>>(std::__cxx11::string_const&)>
    ::
    function<absl::lts_20240722::time_internal::cctz::TimeZoneInfo::Load(std::__cxx11::string_const&)::__0,void>
              ((function<std::unique_ptr<absl::lts_20240722::time_internal::cctz::ZoneInfoSource,std::default_delete<absl::lts_20240722::time_internal::cctz::ZoneInfoSource>>(std::__cxx11::string_const&)>
                *)&local_50,&local_51);
    (*(code *)puVar1)(&local_30,name,&local_50);
    std::
    function<std::unique_ptr<absl::lts_20240722::time_internal::cctz::ZoneInfoSource,_std::default_delete<absl::lts_20240722::time_internal::cctz::ZoneInfoSource>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_50);
    bVar2 = std::operator!=(&local_30,(nullptr_t)0x0);
    local_89 = false;
    if (bVar2) {
      zip_00 = std::
               unique_ptr<absl::lts_20240722::time_internal::cctz::ZoneInfoSource,_std::default_delete<absl::lts_20240722::time_internal::cctz::ZoneInfoSource>_>
               ::get(&local_30);
      local_89 = Load(this,zip_00);
    }
    this_local._7_1_ = local_89;
    std::
    unique_ptr<absl::lts_20240722::time_internal::cctz::ZoneInfoSource,_std::default_delete<absl::lts_20240722::time_internal::cctz::ZoneInfoSource>_>
    ::~unique_ptr(&local_30);
  }
  return this_local._7_1_;
}

Assistant:

bool TimeZoneInfo::Load(const std::string& name) {
  // We can ensure that the loading of UTC or any other fixed-offset
  // zone never fails because the simple, fixed-offset state can be
  // internally generated. Note that this depends on our choice to not
  // accept leap-second encoded ("right") zoneinfo.
  auto offset = seconds::zero();
  if (FixedOffsetFromName(name, &offset)) {
    return ResetToBuiltinUTC(offset);
  }

  // Find and use a ZoneInfoSource to load the named zone.
  auto zip = cctz_extension::zone_info_source_factory(
      name, [](const std::string& n) -> std::unique_ptr<ZoneInfoSource> {
        if (auto z = FileZoneInfoSource::Open(n)) return z;
        if (auto z = AndroidZoneInfoSource::Open(n)) return z;
        if (auto z = FuchsiaZoneInfoSource::Open(n)) return z;
        return nullptr;
      });
  return zip != nullptr && Load(zip.get());
}